

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall rtc::Buffer::Buffer(Buffer *this,Buffer *buf)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  FatalMessage local_1a0;
  FatalMessageVoidify local_25 [13];
  Buffer *local_18;
  Buffer *buf_local;
  Buffer *this_local;
  
  local_18 = buf;
  buf_local = this;
  sVar2 = size(buf);
  this->size_ = sVar2;
  sVar2 = capacity(local_18);
  this->capacity_ = sVar2;
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
            (&this->data_,&local_18->data_);
  bVar1 = IsConsistent(this);
  if (!bVar1) {
    FatalMessageVoidify::FatalMessageVoidify(local_25);
    FatalMessage::FatalMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.cc"
               ,0x1a);
    poVar3 = FatalMessage::stream(&local_1a0);
    poVar3 = std::operator<<(poVar3,"Check failed: IsConsistent()");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"# ");
    FatalMessageVoidify::operator&(local_25,poVar3);
    FatalMessage::~FatalMessage(&local_1a0);
  }
  OnMovedFrom(local_18);
  return;
}

Assistant:

Buffer::Buffer(Buffer&& buf)
    : size_(buf.size()),
      capacity_(buf.capacity()),
      data_(std::move(buf.data_)) {
  RTC_DCHECK(IsConsistent());
  buf.OnMovedFrom();
}